

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *eps,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec,int *vecidx,
            number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *rhs,int *rhsidx,int rhsn)

{
  int iVar1;
  int32_t iVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  int *piVar5;
  int32_t iVar6;
  int32_t iVar7;
  undefined8 *puVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  fpclass_type fVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  cpp_dec_float<200U,_int,_void> *pcVar20;
  undefined4 *puVar21;
  cpp_dec_float<200U,_int,_void> *pcVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  uint *puVar24;
  uint uVar25;
  uint uVar26;
  uint *puVar28;
  cpp_dec_float<200U,_int,_void> *pcVar29;
  undefined4 *puVar30;
  bool bVar31;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  int *piVar35;
  byte bVar36;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  ulong local_3b0;
  undefined1 local_378 [32];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [13];
  undefined3 uStack_30b;
  int iStack_308;
  bool bStack_304;
  undefined8 local_300;
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [13];
  undefined3 uStack_28b;
  int iStack_288;
  bool bStack_284;
  undefined8 local_280;
  int *local_278;
  int *local_270;
  pointer local_268;
  int *local_260;
  int *local_258;
  int *local_250;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_248;
  int *local_240;
  undefined1 local_238 [32];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [13];
  undefined3 uStack_1cb;
  int iStack_1c8;
  bool bStack_1c4;
  fpclass_type local_1c0;
  int32_t iStack_1bc;
  undefined1 local_1b8 [32];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [13];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140 [2];
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  long lVar27;
  
  bVar36 = 0;
  local_238._0_16_ = (undefined1  [16])0x0;
  local_238._16_16_ = (undefined1  [16])0x0;
  local_218 = (undefined1  [16])0x0;
  local_208 = (undefined1  [16])0x0;
  local_1f8 = (undefined1  [16])0x0;
  local_1e8 = (undefined1  [16])0x0;
  local_1d8 = SUB1613((undefined1  [16])0x0,0);
  uStack_1cb = 0;
  local_280._0_4_ = cpp_dec_float_finite;
  local_280._4_4_ = 0x1c;
  local_2f8._0_16_ = (undefined1  [16])0x0;
  local_2f8._16_16_ = (undefined1  [16])0x0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  local_2b8 = (undefined1  [16])0x0;
  local_2a8 = (undefined1  [16])0x0;
  local_298 = SUB1613((undefined1  [16])0x0,0);
  iVar14 = 0;
  uStack_28b = 0;
  iStack_288 = 0;
  bStack_284 = false;
  if (0 < rhsn) {
    local_250 = (this->row).orig;
    piVar5 = (this->col).orig;
    local_240 = (this->col).perm;
    uVar17 = 0;
    do {
      iVar14 = local_240[rhsidx[uVar17]];
      if (uVar17 == 0) {
        lVar27 = 0;
      }
      else {
        uVar33 = uVar17 & 0xffffffff;
        do {
          uVar34 = (uint)uVar33 - 1;
          uVar25 = uVar34 >> 1;
          uVar26 = (uint)uVar33;
          if (rhsidx[uVar25] <= iVar14) break;
          rhsidx[uVar33] = rhsidx[uVar25];
          uVar33 = (ulong)uVar25;
          uVar26 = uVar25;
        } while (1 < uVar34);
        lVar27 = (long)(int)uVar26;
      }
      uVar17 = uVar17 + 1;
      rhsidx[lVar27] = iVar14;
    } while (uVar17 != (uint)rhsn);
    if (rhsn < 1) {
      iVar14 = 0;
    }
    else {
      local_268 = (this->u).row.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_270 = (this->u).row.idx;
      local_258 = (this->u).row.len;
      local_278 = (this->u).row.start;
      iVar14 = 0;
      local_260 = vecidx;
      local_248 = vec;
      do {
        iVar11 = *rhsidx;
        uVar26 = rhsn - 1;
        local_3b0 = (ulong)uVar26;
        iVar9 = rhsidx[local_3b0];
        iVar10 = 1;
        iVar13 = 0;
        if (3 < (uint)rhsn) {
          iVar13 = 0;
          do {
            iVar1 = rhsidx[iVar10];
            iVar32 = rhsidx[(long)iVar10 + 1];
            if (iVar1 < iVar32) {
              iVar16 = iVar10;
              iVar32 = iVar1;
              if (iVar9 <= iVar1) goto LAB_0053e459;
            }
            else {
              if (iVar9 <= iVar32) goto LAB_0053e459;
              iVar16 = iVar10 + 1;
            }
            rhsidx[iVar13] = iVar32;
            iVar10 = iVar16 * 2 + 1;
            iVar13 = iVar16;
          } while (iVar10 < (int)(rhsn - 2U));
        }
        if ((iVar10 < (int)uVar26) && (rhsidx[iVar10] < iVar9)) {
          rhsidx[iVar13] = rhsidx[iVar10];
          iVar13 = iVar10;
        }
LAB_0053e459:
        rhsidx[iVar13] = iVar9;
        iVar9 = piVar5[iVar11];
        pcVar20 = &rhs[iVar9].m_backend;
        puVar24 = (uint *)local_238;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          *puVar24 = (pcVar20->data)._M_elems[0];
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar36 * -8 + 4);
          puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
        }
        iStack_1c8 = rhs[iVar9].m_backend.exp;
        bStack_1c4 = rhs[iVar9].m_backend.neg;
        local_1c0 = rhs[iVar9].m_backend.fpclass;
        iStack_1bc = rhs[iVar9].m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&rhs[iVar9].m_backend,0);
        puVar24 = (uint *)local_238;
        puVar28 = (uint *)local_378;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          *puVar28 = *puVar24;
          puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
          puVar28 = puVar28 + (ulong)bVar36 * -2 + 1;
        }
        pnVar19 = eps;
        pcVar20 = &local_b0;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pcVar20->data)._M_elems[0] = (pnVar19->m_backend).data._M_elems[0];
          pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar19 + ((ulong)bVar36 * -2 + 1) * 4);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + ((ulong)bVar36 * -2 + 1) * 4)
          ;
        }
        local_b0.exp = (eps->m_backend).exp;
        local_b0.neg = (eps->m_backend).neg;
        local_b0.fpclass = (eps->m_backend).fpclass;
        local_b0.prec_elem = (eps->m_backend).prec_elem;
        iStack_308 = iStack_1c8;
        bStack_304 = bStack_1c4;
        local_300._0_4_ = local_1c0;
        local_300._4_4_ = iStack_1bc;
        if ((bStack_1c4 == true) &&
           (local_378._0_4_ != 0 || (fpclass_type)_local_1c0 != cpp_dec_float_finite)) {
          bStack_304 = false;
        }
        if ((local_b0.fpclass != cpp_dec_float_NaN && (fpclass_type)_local_1c0 != cpp_dec_float_NaN)
           && (iVar9 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                 ((cpp_dec_float<200U,_int,_void> *)local_378,&local_b0), 0 < iVar9)
           ) {
          iVar11 = local_250[iVar11];
          lVar27 = (long)iVar14;
          iVar14 = iVar14 + 1;
          vecidx[lVar27] = iVar11;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    ((cpp_dec_float<200U,_int,_void> *)local_238,
                     &(this->diag).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar11].m_backend);
          pcVar20 = (cpp_dec_float<200U,_int,_void> *)local_238;
          pnVar19 = local_248 + iVar11;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar19->m_backend).data._M_elems[0] = (pcVar20->data)._M_elems[0];
            pcVar20 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar20 + (ulong)bVar36 * -8 + 4);
            pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar19 + ((ulong)bVar36 * -2 + 1) * 4);
          }
          local_248[iVar11].m_backend.exp = iStack_1c8;
          local_248[iVar11].m_backend.neg = bStack_1c4;
          local_248[iVar11].m_backend.fpclass = local_1c0;
          local_248[iVar11].m_backend.prec_elem = iStack_1bc;
          iVar9 = local_258[iVar11];
          if (iVar9 != 0) {
            piVar35 = local_270 + local_278[iVar11];
            pcVar20 = &local_268[local_278[iVar11]].m_backend;
            do {
              iVar11 = *piVar35;
              pnVar19 = rhs + iVar11;
              pnVar23 = pnVar19;
              puVar24 = (uint *)local_2f8;
              for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                *puVar24 = (pnVar23->m_backend).data._M_elems[0];
                pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar23 + ((ulong)bVar36 * -2 + 1) * 4);
                puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
              }
              iStack_288 = rhs[iVar11].m_backend.exp;
              bStack_284 = rhs[iVar11].m_backend.neg;
              fVar3 = rhs[iVar11].m_backend.fpclass;
              iVar6 = rhs[iVar11].m_backend.prec_elem;
              local_280._0_4_ = fVar3;
              local_280._4_4_ = iVar6;
              if (fVar3 == cpp_dec_float_NaN) {
LAB_0053e6b5:
                local_300._0_4_ = cpp_dec_float_finite;
                local_300._4_4_ = 0x1c;
                local_378._0_16_ = (undefined1  [16])0x0;
                local_378._16_16_ = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = (undefined1  [16])0x0;
                local_328 = (undefined1  [16])0x0;
                local_318 = SUB1613((undefined1  [16])0x0,0);
                uStack_30b = 0;
                iStack_308 = 0;
                bStack_304 = false;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_238;
                if ((cpp_dec_float<200U,_int,_void> *)local_378 != pcVar20) {
                  pcVar29 = (cpp_dec_float<200U,_int,_void> *)local_378;
                  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                    (pcVar29->data)._M_elems[0] = (pcVar22->data)._M_elems[0];
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar36 * -8 + 4);
                    pcVar29 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar29 + (ulong)bVar36 * -8 + 4);
                  }
                  iStack_308 = iStack_1c8;
                  bStack_304 = bStack_1c4;
                  local_300._0_4_ = local_1c0;
                  local_300._4_4_ = iStack_1bc;
                  pcVar22 = pcVar20;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          ((cpp_dec_float<200U,_int,_void> *)local_378,pcVar22);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                          ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                           (cpp_dec_float<200U,_int,_void> *)local_378);
                fVar12 = cpp_dec_float_NaN;
                if ((fpclass_type)local_280 == cpp_dec_float_NaN) {
LAB_0053e7b8:
                  puVar21 = (undefined4 *)local_2f8;
                  puVar30 = (undefined4 *)local_1b8;
                  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                    *puVar30 = *puVar21;
                    puVar21 = puVar21 + (ulong)bVar36 * -2 + 1;
                    puVar30 = puVar30 + (ulong)bVar36 * -2 + 1;
                  }
                  puVar8 = &local_280;
                  iVar11 = iStack_288;
                  bVar31 = bStack_284;
                }
                else {
                  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                  cpp_dec_float<long_long>
                            ((cpp_dec_float<200U,_int,_void> *)local_378,0,(type *)0x0);
                  iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                     ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                                      (cpp_dec_float<200U,_int,_void> *)local_378);
                  if (iVar11 != 0) {
                    fVar12 = (fpclass_type)local_280;
                    goto LAB_0053e7b8;
                  }
                  local_140[0]._0_4_ = cpp_dec_float_finite;
                  local_140[0]._4_4_ = 0x1c;
                  local_1b8._0_16_ = (undefined1  [16])0x0;
                  local_1b8._16_16_ = (undefined1  [16])0x0;
                  local_198 = (undefined1  [16])0x0;
                  local_188 = (undefined1  [16])0x0;
                  local_178 = (undefined1  [16])0x0;
                  local_168 = (undefined1  [16])0x0;
                  local_158 = SUB1613((undefined1  [16])0x0,0);
                  uStack_14b = 0;
                  iStack_148 = 0;
                  bStack_144 = false;
                  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                            ((cpp_dec_float<200u,int,void> *)local_1b8,1e-100);
                  puVar8 = local_140;
                  fVar12 = (fpclass_type)local_140[0];
                  iVar11 = iStack_148;
                  bVar31 = bStack_144;
                }
                iVar2 = *(int32_t *)((long)puVar8 + 4);
                puVar24 = (uint *)local_1b8;
                pnVar23 = pnVar19;
                for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pnVar23->m_backend).data._M_elems[0] = *puVar24;
                  puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
                  pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar23 + ((ulong)bVar36 * -2 + 1) * 4);
                }
                (pnVar19->m_backend).exp = iVar11;
                (pnVar19->m_backend).neg = bVar31;
                (pnVar19->m_backend).fpclass = fVar12;
                (pnVar19->m_backend).prec_elem = iVar2;
              }
              else {
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<200U,_int,_void> *)local_378,0,(type *)0x0);
                iVar10 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   ((cpp_dec_float<200U,_int,_void> *)local_2f8,
                                    (cpp_dec_float<200U,_int,_void> *)local_378);
                iVar13 = iStack_1c8;
                if (iVar10 != 0) goto LAB_0053e6b5;
                puVar24 = (uint *)local_238;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
                for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pcVar22->data)._M_elems[0] = *puVar24;
                  puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar36 * -8 + 4);
                }
                iStack_148 = iStack_1c8;
                bStack_144 = bStack_1c4;
                fVar12 = local_1c0;
                iVar2 = iStack_1bc;
                local_140[0]._0_4_ = local_1c0;
                local_140[0]._4_4_ = iStack_1bc;
                bVar15 = bStack_1c4;
                if (local_1b8._0_4_ != 0 || fVar12 != cpp_dec_float_finite) {
                  bVar15 = bStack_1c4 ^ 1;
                  bStack_144 = (bool)bVar15;
                }
                local_300._0_4_ = cpp_dec_float_finite;
                local_300._4_4_ = 0x1c;
                local_378._0_16_ = (undefined1  [16])0x0;
                local_378._16_16_ = (undefined1  [16])0x0;
                local_358 = (undefined1  [16])0x0;
                local_348 = (undefined1  [16])0x0;
                local_338 = (undefined1  [16])0x0;
                local_328 = (undefined1  [16])0x0;
                local_318 = SUB1613((undefined1  [16])0x0,0);
                uStack_30b = 0;
                iStack_308 = 0;
                bStack_304 = false;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_1b8;
                bStack_144 = (bool)bVar15;
                if ((cpp_dec_float<200U,_int,_void> *)local_378 != pcVar20) {
                  puVar24 = (uint *)local_238;
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_378;
                  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                    (pcVar22->data)._M_elems[0] = *puVar24;
                    puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
                    pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar22 + (ulong)bVar36 * -8 + 4);
                  }
                  iStack_308 = iVar13;
                  local_300._0_4_ = fVar12;
                  local_300._4_4_ = iVar2;
                  pcVar22 = pcVar20;
                  bStack_304 = (bool)bVar15;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          ((cpp_dec_float<200U,_int,_void> *)local_378,pcVar22);
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_378;
                puVar24 = (uint *)local_2f8;
                for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                  *puVar24 = (pcVar22->data)._M_elems[0];
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar36 * -8 + 4);
                  puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
                }
                iStack_288 = iStack_308;
                bStack_284 = bStack_304;
                local_280._0_4_ = (fpclass_type)local_300;
                local_280._4_4_ = local_300._4_4_;
                puVar24 = (uint *)local_2f8;
                pcVar22 = (cpp_dec_float<200U,_int,_void> *)local_378;
                for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pcVar22->data)._M_elems[0] = *puVar24;
                  puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + (ulong)bVar36 * -8 + 4);
                }
                pnVar23 = eps;
                pcVar22 = &local_130;
                for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                  (pcVar22->data)._M_elems[0] = (pnVar23->m_backend).data._M_elems[0];
                  pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)((long)pnVar23 + ((ulong)bVar36 * -2 + 1) * 4);
                  pcVar22 = (cpp_dec_float<200U,_int,_void> *)
                            ((long)pcVar22 + ((ulong)bVar36 * -2 + 1) * 4);
                }
                local_130.exp = (eps->m_backend).exp;
                local_130.neg = (eps->m_backend).neg;
                fVar4 = (eps->m_backend).fpclass;
                iVar7 = (eps->m_backend).prec_elem;
                local_130.fpclass = fVar4;
                local_130.prec_elem = iVar7;
                if ((bStack_304 == true) &&
                   (local_378._0_4_ != 0 || (fpclass_type)local_300 != cpp_dec_float_finite)) {
                  bStack_304 = false;
                }
                if ((fVar4 != cpp_dec_float_NaN && (fpclass_type)local_300 != cpp_dec_float_NaN) &&
                   (iVar13 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
                             compare((cpp_dec_float<200U,_int,_void> *)local_378,&local_130),
                   0 < iVar13)) {
                  puVar24 = (uint *)local_2f8;
                  pnVar23 = pnVar19;
                  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
                    (pnVar23->m_backend).data._M_elems[0] = *puVar24;
                    puVar24 = puVar24 + (ulong)bVar36 * -2 + 1;
                    pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)pnVar23 + ((ulong)bVar36 * -2 + 1) * 4);
                  }
                  (pnVar19->m_backend).exp = iStack_288;
                  (pnVar19->m_backend).neg = bStack_284;
                  (pnVar19->m_backend).fpclass = (fpclass_type)local_280;
                  (pnVar19->m_backend).prec_elem = local_280._4_4_;
                  iVar11 = local_240[iVar11];
                  uVar25 = (uint)local_3b0;
                  uVar26 = uVar25;
                  if (0 < (int)uVar25) {
                    do {
                      uVar18 = (uint)local_3b0 - 1;
                      uVar34 = uVar18 >> 1;
                      uVar26 = (uint)local_3b0;
                      if (rhsidx[uVar34] <= iVar11) break;
                      rhsidx[local_3b0] = rhsidx[uVar34];
                      local_3b0 = (ulong)uVar34;
                      uVar26 = uVar34;
                    } while (1 < uVar18);
                  }
                  local_3b0 = (ulong)(uVar25 + 1);
                  rhsidx[(int)uVar26] = iVar11;
                }
              }
              piVar35 = piVar35 + 1;
              pcVar20 = pcVar20 + 1;
              iVar9 = iVar9 + -1;
              vecidx = local_260;
              uVar26 = (uint)local_3b0;
            } while (iVar9 != 0);
          }
        }
        local_3b0._0_4_ = uVar26;
        rhsn = (uint)local_3b0;
      } while (0 < (int)(uint)local_3b0);
    }
  }
  return iVar14;
}

Assistant:

int CLUFactor<R>::solveUleft(R eps,
                             R* vec, int* vecidx,
                             R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, n, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   n = 0;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         vecidx[n++] = r;
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }

   return n;
}